

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O1

Alignment * __thiscall
spoa::SisdAlignmentEngine::Affine
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,uint32_t sequence_len,
          Graph *graph,int32_t *score)

{
  long lVar1;
  char cVar2;
  char cVar3;
  AlignmentType AVar4;
  uint uVar5;
  pointer ppNVar6;
  Implementation *pIVar7;
  int32_t *piVar8;
  int32_t *piVar9;
  Node *pNVar10;
  pointer ppEVar11;
  pointer ppEVar12;
  ulong uVar13;
  pointer ppVar14;
  uint uVar15;
  long lVar16;
  pointer ppEVar17;
  pointer ppVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  Alignment *alignment;
  uint local_ec;
  uint local_d4;
  ulong local_d0;
  SisdAlignmentEngine *local_c8;
  int32_t *local_c0;
  ulong local_b8;
  uint local_b0;
  uint local_ac;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_a8;
  int32_t *local_a0;
  int32_t *local_98;
  long local_90;
  ulong local_88;
  int local_80;
  uint local_7c;
  Graph *local_78;
  int32_t *local_70;
  AlignmentType local_64;
  long local_60;
  int32_t *local_58;
  int32_t *local_50;
  pointer local_48;
  pointer local_40;
  long local_38;
  
  uVar30 = sequence_len + 1;
  local_88 = (ulong)uVar30;
  AVar4 = (this->super_AlignmentEngine).type_;
  uVar19 = 0x80000400;
  if (AVar4 == kSW) {
    uVar19 = 0;
  }
  ppNVar6 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_48 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppNVar6 == local_48) {
    uVar25 = 0;
    uVar29 = 0;
  }
  else {
    pIVar7 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    local_70 = *(int32_t **)
                &(pIVar7->node_id_to_rank).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    piVar8 = pIVar7->H;
    piVar9 = pIVar7->F;
    local_80 = (int)(this->super_AlignmentEngine).g_;
    iVar26 = (int)(this->super_AlignmentEngine).e_;
    local_a0 = (int32_t *)(local_88 * 4);
    lVar1 = local_88 * 4 + -4;
    local_60 = *(long *)&(pIVar7->sequence_profile).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl + 4;
    local_50 = pIVar7->E + 1;
    local_38 = local_88 - 2;
    uVar25 = 0;
    uVar29 = 0;
    do {
      local_7c = uVar19;
      local_40 = ppNVar6;
      local_b8 = uVar29;
      pNVar10 = *local_40;
      ppEVar11 = (pNVar10->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar12 = (pNVar10->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppEVar11 == ppEVar12) {
        uVar29 = 0;
      }
      else {
        uVar29 = (ulong)(local_70[(*ppEVar11)->tail->id] + 1);
      }
      uVar19 = pNVar10->code;
      local_b0 = local_70[pNVar10->id] + 1;
      uVar13 = (ulong)local_b0;
      if (1 < uVar30) {
        lVar16 = uVar29 * (long)local_a0;
        lVar21 = 0;
        do {
          iVar22 = *(int *)((long)piVar8 + lVar21 + lVar16 + 4) + local_80;
          iVar31 = *(int *)((long)piVar9 + lVar21 + lVar16 + 4) + iVar26;
          if (iVar31 < iVar22) {
            iVar31 = iVar22;
          }
          *(int *)((long)piVar9 + lVar21 + (long)local_a0 * uVar13 + 4) = iVar31;
          *(int *)((long)piVar8 + lVar21 + (long)local_a0 * uVar13 + 4) =
               *(int *)((long)local_a0 * (ulong)uVar19 + local_60 + lVar21) +
               *(int *)((long)piVar8 + lVar21 + lVar16);
          lVar21 = lVar21 + 4;
        } while (lVar1 != lVar21);
      }
      uVar29 = (long)ppEVar12 - (long)ppEVar11 >> 3;
      if (1 < uVar29) {
        cVar2 = (this->super_AlignmentEngine).g_;
        cVar3 = (this->super_AlignmentEngine).e_;
        lVar16 = (long)local_a0 * uVar13 + 4;
        lVar21 = (long)local_a0 * uVar13 + 4;
        uVar27 = 1;
        do {
          if (1 < uVar30) {
            lVar23 = (ulong)(local_70[ppEVar11[uVar27]->tail->id] + 1) * (long)local_a0;
            lVar24 = 0;
            do {
              iVar32 = *(int *)((long)piVar8 + lVar24 + lVar23 + 4) + (int)cVar2;
              iVar22 = *(int *)((long)piVar9 + lVar24 + lVar23 + 4) + (int)cVar3;
              iVar31 = *(int *)((long)piVar9 + lVar24 + lVar21);
              if (iVar22 < iVar32) {
                iVar22 = iVar32;
              }
              if (iVar22 < iVar31) {
                iVar22 = iVar31;
              }
              *(int *)((long)piVar9 + lVar24 + lVar21) = iVar22;
              iVar22 = *(int *)((ulong)uVar19 * (long)local_a0 + local_60 + lVar24) +
                       *(int *)((long)piVar8 + lVar24 + lVar23);
              iVar31 = *(int *)((long)piVar8 + lVar24 + lVar16);
              if (iVar22 < iVar31) {
                iVar22 = iVar31;
              }
              *(int *)((long)piVar8 + lVar24 + lVar16) = iVar22;
              lVar24 = lVar24 + 4;
            } while (lVar1 != lVar24);
          }
          uVar27 = (ulong)((int)uVar27 + 1);
        } while (uVar27 < uVar29);
      }
      uVar29 = local_b8;
      uVar19 = local_7c;
      if (1 < uVar30) {
        lVar21 = uVar13 * (long)local_a0;
        lVar16 = lVar21 + 4;
        lVar23 = 0;
        uVar20 = local_7c;
        do {
          uVar19 = *(int *)((long)piVar8 + lVar23 * 4 + lVar21) + local_80;
          uVar15 = *(int *)((long)local_50 + lVar23 * 4 + lVar21 + -4) + iVar26;
          if ((int)uVar15 < (int)uVar19) {
            uVar15 = uVar19;
          }
          *(uint *)((long)local_50 + lVar23 * 4 + lVar21) = uVar15;
          uVar19 = *(uint *)((long)piVar9 + lVar23 * 4 + lVar21 + 4);
          uVar5 = *(uint *)((long)piVar8 + lVar23 * 4 + lVar16);
          if ((int)uVar15 < (int)uVar19) {
            uVar15 = uVar19;
          }
          if ((int)uVar15 < (int)uVar5) {
            uVar15 = uVar5;
          }
          *(uint *)((long)piVar8 + lVar23 * 4 + lVar16) = uVar15;
          uVar19 = uVar20;
          if (AVar4 == kOV) {
            if ((pNVar10->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                (pNVar10->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
LAB_00121a55:
              uVar15 = *(uint *)((long)piVar8 + lVar23 * 4 + lVar16);
              if ((int)uVar20 <= (int)uVar15) {
                uVar19 = uVar15;
              }
              if ((int)uVar20 < (int)uVar15) {
                uVar25 = (ulong)local_b0;
                uVar29 = (ulong)((int)lVar23 + 1);
              }
            }
          }
          else if (AVar4 == kNW) {
            if ((local_38 == lVar23) &&
               ((pNVar10->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                (pNVar10->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish)) goto LAB_00121a55;
          }
          else if (AVar4 == kSW) {
            uVar15 = ~((int)uVar15 >> 0x1f) & uVar15;
            *(uint *)((long)piVar8 + lVar23 * 4 + lVar16) = uVar15;
            if ((int)uVar20 <= (int)uVar15) {
              uVar19 = uVar15;
            }
            if ((int)uVar20 < (int)uVar15) {
              uVar25 = (ulong)local_b0;
              uVar29 = (ulong)((int)lVar23 + 1);
            }
          }
          lVar23 = lVar23 + 1;
          uVar20 = uVar19;
        } while (local_88 - 1 != lVar23);
      }
      ppNVar6 = local_40 + 1;
      local_64 = AVar4;
    } while (local_40 + 1 != local_48);
  }
  if ((int)uVar25 == 0 && (int)uVar29 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return (Alignment *)
           (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)__return_storage_ptr__;
  }
  if (score != (int32_t *)0x0) {
    *score = uVar19;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar27 = 0;
  local_ec = 0;
  uVar13 = local_88;
  local_c8 = this;
  local_a8 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)__return_storage_ptr__
  ;
  local_78 = graph;
  local_58 = score;
  do {
    AVar4 = (this->super_AlignmentEngine).type_;
    iVar26 = (int)uVar25;
    uVar19 = (uint)uVar29;
    if (AVar4 == kOV) {
      uVar30 = uVar19;
      if (iVar26 == 0) goto LAB_0012208e;
joined_r0x00121b6f:
      if (uVar30 == 0) goto LAB_0012208e;
    }
    else {
      if (AVar4 != kNW) {
        if (AVar4 == kSW) {
          uVar30 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl)->H[uVar25 * uVar13 + uVar29];
          goto joined_r0x00121b6f;
        }
LAB_0012208e:
        ppVar14 = *(pointer *)__return_storage_ptr__;
        ppVar18 = *(pointer *)((long)__return_storage_ptr__ + 8) + -1;
        if (ppVar18 <= ppVar14 || ppVar14 == *(pointer *)((long)__return_storage_ptr__ + 8)) {
          return __return_storage_ptr__;
        }
        do {
          iVar26 = ppVar14->first;
          ppVar14->first = ppVar18->first;
          ppVar18->first = iVar26;
          iVar26 = ppVar14->second;
          ppVar14->second = ppVar18->second;
          ppVar18->second = iVar26;
          ppVar14 = ppVar14 + 1;
          ppVar18 = ppVar18 + -1;
        } while (ppVar14 < ppVar18);
        return __return_storage_ptr__;
      }
      if (iVar26 == 0 && uVar19 == 0) goto LAB_0012208e;
    }
    pIVar7 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    local_c0 = pIVar7->H;
    local_90 = uVar25 * uVar13;
    local_98 = local_c0 + local_90;
    iVar31 = local_98[uVar29];
    uVar33 = uVar27;
    bVar36 = false;
    if ((uVar19 != 0) && (bVar36 = false, iVar26 != 0)) {
      pNVar10 = (local_78->rank_to_node_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar26 - 1];
      ppEVar11 = (pNVar10->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar12 = *(pointer *)
                  ((long)&(pNVar10->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      if (ppEVar11 == ppEVar12) {
        uVar30 = 0;
      }
      else {
        uVar30 = *(int *)(*(long *)&(pIVar7->node_id_to_rank).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         + (ulong)(*ppEVar11)->tail->id * 4) + 1;
      }
      iVar22 = *(int *)(pNVar10->code * uVar13 * 4 +
                        *(long *)&(pIVar7->sequence_profile).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar29 * 4
                       );
      uVar20 = uVar19 - 1;
      bVar36 = true;
      if (iVar31 == local_c0[uVar30 * uVar13 + (ulong)uVar20] + iVar22) {
        uVar33 = (ulong)uVar30;
        local_ec = uVar20;
      }
      else {
        uVar27 = (long)ppEVar12 - (long)ppEVar11 >> 3;
        if (uVar27 < 2) {
          bVar36 = false;
        }
        else {
          uVar28 = 1;
          uVar30 = 2;
          do {
            uVar15 = *(int *)(*(long *)&(pIVar7->node_id_to_rank).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             + (ulong)ppEVar11[uVar28]->tail->id * 4) + 1;
            this = local_c8;
            uVar13 = local_88;
            if (iVar31 == local_c0[(ulong)uVar20 + uVar15 * local_88] + iVar22) {
              uVar33 = (ulong)uVar15;
              local_ec = uVar20;
              local_b8 = uVar29;
              goto LAB_00121cbd;
            }
            uVar28 = (ulong)uVar30;
            uVar30 = uVar30 + 1;
          } while (uVar28 < uVar27);
          bVar36 = false;
          local_b8 = uVar29;
        }
      }
    }
LAB_00121cbd:
    uVar27 = uVar33;
    bVar34 = false;
    if ((!bVar36) && (bVar34 = false, iVar26 != 0)) {
      pNVar10 = (local_78->rank_to_node_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar26 - 1];
      ppEVar11 = (pNVar10->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar12 = *(pointer *)
                  ((long)&(pNVar10->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      if (ppEVar11 == ppEVar12) {
        uVar30 = 0;
      }
      else {
        uVar30 = *(int *)(*(long *)&(pIVar7->node_id_to_rank).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         + (ulong)(*ppEVar11)->tail->id * 4) + 1;
      }
      iVar22 = (int)(this->super_AlignmentEngine).e_;
      bVar34 = iVar31 == pIVar7->F[uVar30 * uVar13 + uVar29] + iVar22;
      if (bVar34) {
        bVar36 = true;
        uVar27 = (ulong)uVar30;
        local_ec = uVar19;
        local_b8 = uVar29;
      }
      else {
        iVar32 = (int)(this->super_AlignmentEngine).g_;
        if (iVar31 == local_c0[uVar30 * uVar13 + uVar29] + iVar32) {
          uVar27 = (ulong)uVar30;
LAB_00121d87:
          bVar36 = true;
          local_ec = uVar19;
          local_b8 = uVar29;
        }
        else {
          uVar28 = (long)ppEVar12 - (long)ppEVar11 >> 3;
          if (uVar28 < 2) {
            bVar34 = false;
            local_b8 = uVar29;
          }
          else {
            local_a0 = pIVar7->F + uVar29;
            local_70 = local_c0 + uVar29;
            local_c0 = *(int32_t **)
                        &(pIVar7->node_id_to_rank).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
            uVar27 = 1;
            uVar30 = 2;
            do {
              uVar27 = (ulong)(local_c0[ppEVar11[uVar27]->tail->id] + 1);
              bVar34 = iVar31 == local_a0[uVar27 * uVar13] + iVar22;
              __return_storage_ptr__ = (Alignment *)local_a8;
              if (bVar34) {
                bVar36 = true;
                local_ec = uVar19;
                local_b8 = uVar29;
                goto LAB_00121e63;
              }
              if (iVar31 == local_70[uVar27 * uVar13] + iVar32) goto LAB_00121d87;
              uVar27 = (ulong)uVar30;
              uVar30 = uVar30 + 1;
            } while (uVar27 < uVar28);
            bVar34 = false;
            uVar27 = uVar33;
            local_b8 = uVar29;
          }
        }
      }
    }
LAB_00121e63:
    bVar35 = false;
    if ((!bVar36) && (bVar35 = false, uVar19 != 0)) {
      bVar35 = iVar31 == (int)(local_c8->super_AlignmentEngine).e_ +
                         pIVar7->E[local_90 + (uVar29 - 1)];
      if ((bVar35) || (iVar31 == (int)(local_c8->super_AlignmentEngine).g_ + local_98[uVar29 - 1]))
      {
        local_ec = uVar19 - 1;
        uVar27 = uVar25;
      }
      else {
        bVar35 = false;
      }
    }
    local_d4 = 0xffffffff;
    if (iVar26 != (int)uVar27) {
      local_d4 = (local_78->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar26 - 1]->id;
    }
    local_ac = uVar19 - 1;
    if (uVar19 == local_ec) {
      local_ac = 0xffffffff;
    }
    local_d0 = uVar25;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,unsigned_int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,&local_d4,&local_ac);
    this = local_c8;
    uVar25 = uVar27;
    if (bVar35) {
      uVar29 = (ulong)local_ec;
      do {
        local_d4 = 0xffffffff;
        uVar19 = (int)uVar29 - 1;
        uVar29 = (ulong)uVar19;
        local_ac = uVar19;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<int,unsigned_int>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,(int *)&local_d4,&local_ac);
        piVar8 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                 _M_head_impl)->E;
      } while ((int)(this->super_AlignmentEngine).e_ + piVar8[uVar27 * uVar13 + (ulong)uVar19] ==
               piVar8[uVar27 * uVar13 + (ulong)uVar19 + 1]);
    }
    else {
      uVar29 = (ulong)local_ec;
      if (bVar34) {
        uVar29 = (ulong)local_ec;
        do {
          __return_storage_ptr__ = (Alignment *)local_a8;
          pNVar10 = (local_78->rank_to_node_).
                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[(int)uVar27 - 1];
          ppEVar11 = (pNVar10->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar12 = *(pointer *)
                      ((long)&(pNVar10->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          if (ppEVar11 == ppEVar12) {
            uVar27 = 0;
            bVar36 = false;
          }
          else {
            pIVar7 = (local_c8->pimpl_)._M_t.
                     super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                     .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                     _M_head_impl;
            iVar26 = pIVar7->F[uVar29 + uVar27 * uVar13];
            uVar25 = 0;
            do {
              ppEVar17 = ppEVar11 + 1;
              uVar13 = (ulong)(*(int *)(*(long *)&(pIVar7->node_id_to_rank).
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       + (ulong)(*ppEVar11)->tail->id * 4) + 1);
              bVar34 = true;
              bVar36 = iVar26 == pIVar7->H[uVar29 + uVar13 * local_88] +
                                 (int)(local_c8->super_AlignmentEngine).g_;
              uVar27 = uVar13;
              if ((!bVar36) &&
                 (bVar34 = iVar26 == pIVar7->F[uVar29 + uVar13 * local_88] +
                                     (int)(local_c8->super_AlignmentEngine).e_, uVar27 = uVar25,
                 bVar34)) {
                uVar27 = uVar13;
              }
            } while ((!bVar34) && (uVar25 = uVar27, ppEVar11 = ppEVar17, ppEVar17 != ppEVar12));
          }
          local_d4 = 0xffffffff;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<unsigned_int&,int>(local_a8,&pNVar10->id,(int *)&local_d4);
          uVar13 = local_88;
        } while (!bVar36 && (int)uVar27 != 0);
        uVar29 = (ulong)local_ec;
        uVar25 = uVar27;
        this = local_c8;
      }
    }
  } while( true );
}

Assistant:

Alignment SisdAlignmentEngine::Affine(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
  std::uint64_t matrix_width = sequence_len + 1;
  const auto& rank_to_node = graph.rank_to_node();

  std::int32_t max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;
  std::uint32_t max_i = 0;
  std::uint32_t max_j = 0;
  auto update_max_score = [&max_score, &max_i, &max_j] (
      std::int32_t* H_row,
      std::uint32_t i,
      std::uint32_t j) -> void {
    if (max_score < H_row[j]) {
      max_score = H_row[j];
      max_i = i;
      max_j = j;
    }
    return;
  };

  // alignment
  for (const auto& it : rank_to_node) {
    const auto& char_profile =
        &(pimpl_->sequence_profile[it->code * matrix_width]);

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ? 0 :
        pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    std::int32_t* H_row = &(pimpl_->H[i * matrix_width]);
    std::int32_t* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    std::int32_t* F_row = &(pimpl_->F[i * matrix_width]);
    std::int32_t* F_pred_row = &(pimpl_->F[pred_i * matrix_width]);

    // update F and H
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      F_row[j] = std::max(
          H_pred_row[j] + g_,
          F_pred_row[j] + e_);
      H_row[j] = H_pred_row[j - 1] + char_profile[j];
    }
    // check other predeccessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);
      F_pred_row = &(pimpl_->F[pred_i * matrix_width]);

      for (std::uint64_t j = 1; j < matrix_width; ++j) {
        F_row[j] = std::max(
            F_row[j],
            std::max(
                H_pred_row[j] + g_,
                F_pred_row[j] + e_));
        H_row[j] = std::max(
            H_row[j],
            H_pred_row[j - 1] + char_profile[j]);
      }
    }

    // update E and H
    std::int32_t* E_row = &(pimpl_->E[i * matrix_width]);
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      E_row[j] = std::max(H_row[j - 1] + g_, E_row[j - 1] + e_);
      H_row[j] = std::max(H_row[j], std::max(F_row[j], E_row[j]));

      if (type_ == AlignmentType::kSW) {
        H_row[j] = std::max(H_row[j], 0);
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kNW &&
          (it->outedges.empty() && j == matrix_width - 1)) {
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kOV && (it->outedges.empty())) {
        update_max_score(H_row, i, j);
      }
    }
  }

  if (max_i == 0 && max_j == 0) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  // backtrack
  Alignment alignment;
  std::uint32_t i = max_i;
  std::uint32_t j = max_j;

  auto sw_condition = [this, &i, &j, &matrix_width] () -> bool {
    return (pimpl_->H[i * matrix_width + j] == 0) ? false : true;
  };
  auto nw_condition = [&i, &j] () -> bool {
    return (i == 0 && j == 0) ? false : true;
  };
  auto ov_condition = [&i, &j] () -> bool {
    return (i == 0 || j == 0) ? false : true;
  };

  std::uint32_t prev_i = 0;
  std::uint32_t prev_j = 0;

  while ((type_ == AlignmentType::kSW && sw_condition()) ||
         (type_ == AlignmentType::kNW && nw_condition()) ||
         (type_ == AlignmentType::kOV && ov_condition())) {
    auto H_ij = pimpl_->H[i * matrix_width + j];
    bool predecessor_found = false, extend_left = false, extend_up = false;

    if (i != 0 && j != 0) {
      const auto& it = rank_to_node[i - 1];
      std::int32_t match_cost =
          pimpl_->sequence_profile[it->code * matrix_width + j];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
        prev_i = pred_i;
        prev_j = j - 1;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
            prev_i = pred_i;
            prev_j = j - 1;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && i != 0) {
      const auto& it = rank_to_node[i - 1];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if ((extend_up = H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||
                       H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
        prev_i = pred_i;
        prev_j = j;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if ((extend_up = H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||
                           H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
            prev_i = pred_i;
            prev_j = j;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && j != 0) {
      if ((extend_left = H_ij == pimpl_->E[i * matrix_width + j - 1] + e_) ||
                         H_ij == pimpl_->H[i * matrix_width + j - 1] + g_) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j - 1);

    i = prev_i;
    j = prev_j;

    if (extend_left) {
      while (true) {
        alignment.emplace_back(-1, j - 1);
        --j;
        if (pimpl_->E[i * matrix_width + j] + e_ !=
            pimpl_->E[i * matrix_width + j + 1]) {
          break;
        }
      }
    } else if (extend_up) {
      while (true) {
        bool stop = false;
        prev_i = 0;
        for (const auto& it : rank_to_node[i - 1]->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;

          if ((stop = pimpl_->F[i * matrix_width + j] == pimpl_->H[pred_i * matrix_width + j] + g_) ||  // NOLINT
                      pimpl_->F[i * matrix_width + j] == pimpl_->F[pred_i * matrix_width + j] + e_) {  // NOLINT
            prev_i = pred_i;
            break;
          }
        }

        alignment.emplace_back(rank_to_node[i - 1]->id, -1);
        i = prev_i;
        if (stop || i == 0) {
          break;
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
}